

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O2

int spki_table_get_all(spki_table *spki_table,uint32_t asn,uint8_t *ski,spki_record **result,
                      uint *result_size)

{
  uint uVar1;
  long lVar2;
  undefined8 *__s1;
  undefined8 uVar3;
  tommy_uint32_t hash;
  int iVar4;
  tommy_node_struct *ptVar5;
  spki_record *psVar6;
  ulong uVar7;
  long lVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  long in_FS_OFFSET;
  byte bVar11;
  
  bVar11 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  hash = tommy_inthash_u32(asn);
  *result = (spki_record *)0x0;
  *result_size = 0;
  pthread_rwlock_rdlock((pthread_rwlock_t *)&spki_table->lock);
  ptVar5 = tommy_hashlin_bucket(&spki_table->hashtable,hash);
  if (ptVar5 != (tommy_hashlin_node *)0x0) {
    for (; ptVar5 != (tommy_hashlin_node *)0x0; ptVar5 = ptVar5->next) {
      __s1 = (undefined8 *)ptVar5->data;
      if ((*(uint32_t *)((long)__s1 + 0x14) == asn) && (iVar4 = bcmp(__s1,ski,0x14), iVar4 == 0)) {
        uVar1 = *result_size;
        *result_size = uVar1 + 1;
        psVar6 = (spki_record *)lrtr_realloc(*result,(ulong)(uVar1 + 1) << 7);
        if (psVar6 == (spki_record *)0x0) {
          lrtr_free(*result);
          iVar4 = -1;
          goto LAB_0010c9b2;
        }
        *result = psVar6;
        uVar7 = (ulong)*result_size;
        psVar6[uVar7 - 1].asn = *(uint32_t *)((long)__s1 + 0x14);
        psVar6[uVar7 - 1].socket = (rtr_socket *)__s1[0xf];
        uVar3 = __s1[1];
        *(undefined8 *)psVar6[uVar7 - 1].ski = *__s1;
        *(undefined8 *)(psVar6[uVar7 - 1].ski + 8) = uVar3;
        *(undefined4 *)(psVar6[uVar7 - 1].ski + 0x10) = *(undefined4 *)(__s1 + 2);
        puVar9 = (uint8_t *)(__s1 + 3);
        puVar10 = psVar6[uVar7 - 1].spki;
        for (lVar8 = 0x5b; lVar8 != 0; lVar8 = lVar8 + -1) {
          *puVar10 = *puVar9;
          puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
          puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
        }
      }
    }
  }
  iVar4 = 0;
LAB_0010c9b2:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
  return iVar4;
}

Assistant:

int spki_table_get_all(struct spki_table *spki_table, uint32_t asn, uint8_t *ski, struct spki_record **result,
		       unsigned int *result_size)
{
	uint32_t hash = tommy_inthash_u32(asn);
	tommy_node *result_bucket;
	void *tmp;

	*result = NULL;
	*result_size = 0;

	pthread_rwlock_rdlock(&spki_table->lock);

	/**
	 * A tommy node contains its storing key_entry (->data) as well as
	 * next and prev pointer to accommodate multiple results.
	 * The bucket is guaranteed to contain ALL the elements
	 * with the specified hash, but it can contain also others.
	 */
	result_bucket = tommy_hashlin_bucket(&spki_table->hashtable, hash);

	if (!result_bucket) {
		pthread_rwlock_unlock(&spki_table->lock);
		return SPKI_SUCCESS;
	}

	/* Build the result array */
	while (result_bucket) {
		struct key_entry *element;

		element = result_bucket->data;
		if (element->asn == asn && memcmp(element->ski, ski, sizeof(element->ski)) == 0) {
			(*result_size)++;
			tmp = lrtr_realloc(*result, *result_size * sizeof(**result));
			if (!tmp) {
				lrtr_free(*result);
				pthread_rwlock_unlock(&spki_table->lock);
				return SPKI_ERROR;
			}
			*result = tmp;
			key_entry_to_spki_record(element, *result + *result_size - 1);
		}
		result_bucket = result_bucket->next;
	}

	pthread_rwlock_unlock(&spki_table->lock);
	return SPKI_SUCCESS;
}